

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

QWidget * findDnDTarget(QWidget *parent,QPoint *pos)

{
  bool bVar1;
  QWidget *this;
  
  this = QWidget::childAt(parent,pos);
  if (this == (QWidget *)0x0) {
    this = parent;
  }
  while ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
         (bVar1 = QWidget::acceptDrops(this), !bVar1))) {
    this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    if (this == (QWidget *)0x0) {
      return (QWidget *)0x0;
    }
  }
  bVar1 = QWidget::acceptDrops(this);
  if (bVar1) {
    return this;
  }
  return (QWidget *)0x0;
}

Assistant:

static QWidget *findDnDTarget(QWidget *parent, const QPoint &pos)
{
    // Find a target widget under mouse that accepts drops (QTBUG-22987).
    QWidget *widget = parent->childAt(pos);
    if (!widget)
        widget = parent;
    for ( ; widget && !widget->isWindow() && !widget->acceptDrops(); widget = widget->parentWidget()) ;
    if (widget && !widget->acceptDrops())
        widget = nullptr;
    return widget;
}